

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::GetTapScriptTreeInfoByControlBlock
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
  local_58;
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptInfoByControlRequestStruct_const&)>
  ::
  function<cfd::js::api::TapScriptInfoStruct(&)(cfd::js::api::TapScriptInfoByControlRequestStruct_const&),void>
            ((function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptInfoByControlRequestStruct_const&)>
              *)&local_38,AddressStructApi::GetTapScriptTreeInfoByControlBlock);
  std::
  function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptInfoByControlRequestStruct_const&)>
  ::
  function<cfd::js::api::TapScriptInfoStruct(&)(cfd::js::api::TapScriptInfoByControlRequestStruct_const&),void>
            ((function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptInfoByControlRequestStruct_const&)>
              *)&local_58,ElementsAddressStructApi::GetTapScriptTreeInfoByControlBlock);
  ExecuteElementsCheckApi<cfd::js::api::json::TapScriptInfoByControlRequest,cfd::js::api::json::TapScriptInfo,cfd::js::api::TapScriptInfoByControlRequestStruct,cfd::js::api::TapScriptInfoStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
  ::~function(&local_58);
  std::
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::GetTapScriptTreeInfoByControlBlock(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::TapScriptInfoByControlRequest, api::json::TapScriptInfo,
      api::TapScriptInfoByControlRequestStruct, api::TapScriptInfoStruct>(
      request_message, AddressStructApi::GetTapScriptTreeInfoByControlBlock,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressStructApi::GetTapScriptTreeInfoByControlBlock);
#else
      AddressStructApi::GetTapScriptTreeInfoByControlBlock);
#endif
}